

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> * __thiscall
libtorrent::torrent_info::similar_torrents
          (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           *__return_storage_ptr__,torrent_info *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  reference __x;
  digest32<160L> *st_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *__range1_1;
  int *local_50;
  int *st;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  torrent_info *this_local;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *ret;
  
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (__return_storage_ptr__);
  sVar2 = ::std::vector<int,_std::allocator<int>_>::size(&this->m_similar_torrents);
  sVar3 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          size(&this->m_owned_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            (__return_storage_ptr__,sVar2 + sVar3);
  __end1 = ::std::vector<int,_std::allocator<int>_>::begin(&this->m_similar_torrents);
  st = (int *)::std::vector<int,_std::allocator<int>_>::end(&this->m_similar_torrents);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&st), bVar1) {
    local_50 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
    pcVar4 = boost::shared_array<char>::get(&this->m_info_section);
    __range1_1 = (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )(pcVar4 + *local_50);
    ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
    emplace_back<char*>((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                         *)__return_storage_ptr__,(char **)&__range1_1);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ::begin(&this->m_owned_similar_torrents);
  st_1 = (digest32<160L> *)
         ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
         end(&this->m_owned_similar_torrents);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                             *)&st_1), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
          ::operator*(&__end1_1);
    ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    push_back(__return_storage_ptr__,__x);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sha1_hash> torrent_info::similar_torrents() const
	{
		std::vector<sha1_hash> ret;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		ret.reserve(m_similar_torrents.size() + m_owned_similar_torrents.size());

		for (auto const& st : m_similar_torrents)
			ret.emplace_back(m_info_section.get() + st);

		for (auto const& st : m_owned_similar_torrents)
			ret.push_back(st);
#endif

		return ret;
	}